

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O0

string * __thiscall
Uri::Uri::makeFsPath_abi_cxx11_(string *__return_storage_ptr__,Uri *this,Uri *uri)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_19;
  Uri *local_18;
  Uri *uri_local;
  string *value;
  
  local_19 = 0;
  local_18 = this;
  uri_local = (Uri *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar3 = std::__cxx11::string::empty();
  if ((((uVar3 & 1) == 0) && (uVar3 = std::__cxx11::string::length(), 1 < uVar3)) &&
     (bVar1 = std::operator==(&local_18->scheme,"file"), bVar1)) {
    std::operator+(&local_70,"//",&local_18->authority);
    std::operator+(&local_50,&local_70,&local_18->path);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    uVar3 = std::__cxx11::string::length();
    if ((1 < uVar3) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_18->path), *pcVar4 == '/'))
    {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_18->path);
      iVar2 = isalpha((int)*pcVar4);
      if ((iVar2 != 0) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_18->path), *pcVar4 == ':')
         ) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_18->path);
        iVar2 = tolower((int)*pcVar4);
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_18->path);
        std::operator+(&local_90,(char)iVar2,&local_b0);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_18->path);
  }
  return __return_storage_ptr__;
}

Assistant:

string Uri::makeFsPath (const Uri &uri) {
    string value {};

    if (!uri.authority.empty() && uri.path.length() > 1 && uri.scheme == "file") {
        value = "//" + uri.authority + uri.path;
    } else if (
            uri.path.length() >= 2
            && uri.path[0] == CharCode::Slash
            && std::isalpha(uri.path[1])
            && uri.path[2] == CharCode::Colon
            ) {
        value = static_cast<char>(std::tolower(uri.path[1])) + uri.path.substr(2);
    } else {
        value = uri.path;
    }

    if (IS_WINDOWS) {
        forwardToBackslashes(value);
    }

    return value;
}